

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_type_getCanonicalPendingInstanceType(sysbvm_context_t *context,sysbvm_tuple_t type)

{
  _Bool _Var1;
  sysbvm_tuple_t baseType;
  sysbvm_tuple_t thisType;
  sysbvm_pointerLikeType_t *pointerLikeType;
  sysbvm_tuple_t type_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isKindOf(context,type,(context->roots).referenceType);
  if (_Var1) {
    baseType = sysbvm_type_getCanonicalPendingInstanceType(context,*(sysbvm_tuple_t *)(type + 0xf8))
    ;
    context_local =
         (sysbvm_context_t *)
         sysbvm_type_createReferenceType(context,baseType,*(sysbvm_tuple_t *)(type + 0x100));
  }
  else {
    _Var1 = sysbvm_type_isDirectSubtypeOf(type,(context->roots).metatypeType);
    if ((!_Var1) ||
       (context_local = *(sysbvm_context_t **)(type + 0xf8),
       context_local == (sysbvm_context_t *)0x0)) {
      context_local = (sysbvm_context_t *)(context->roots).anyValueType;
    }
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_getCanonicalPendingInstanceType(sysbvm_context_t *context, sysbvm_tuple_t type)
{
    // FIXME: Check the validity of this condition.
    if(sysbvm_tuple_isKindOf(context, type, context->roots.referenceType))
    {
        sysbvm_pointerLikeType_t *pointerLikeType = (sysbvm_pointerLikeType_t*)type;
        return sysbvm_type_createReferenceType(context, sysbvm_type_getCanonicalPendingInstanceType(context, pointerLikeType->baseType), pointerLikeType->addressSpace);
    }

    if(sysbvm_type_isDirectSubtypeOf(type, context->roots.metatypeType))
    {
        sysbvm_tuple_t thisType = ((sysbvm_metatype_t*)type)->thisType;
        if(thisType)
            return thisType;
    }
    
    return context->roots.anyValueType;
}